

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ErrorCode EVar1;
  int iVar2;
  Error *pEVar3;
  string *psVar4;
  undefined1 local_1a0 [40];
  string local_178;
  string configFileName;
  string progName;
  Error error;
  string registryFileName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  error.mCode = kNone;
  error.mMessage._M_dataplus._M_p = (pointer)&error.mMessage.field_2;
  error.mMessage._M_string_length = 0;
  error.mMessage.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&progName,*argv,(allocator *)local_1a0);
  registryFileName._M_dataplus._M_p = (pointer)&registryFileName.field_2;
  registryFileName._M_string_length = 0;
  configFileName._M_dataplus._M_p = (pointer)&configFileName.field_2;
  configFileName._M_string_length = 0;
  registryFileName.field_2._M_local_buf[0] = '\0';
  configFileName.field_2._M_local_buf[0] = '\0';
  do {
    iVar2 = getopt_long(argc,argv,"hvc:r:",gCommissionerCliOptions,0);
    psVar4 = &configFileName;
    if (iVar2 != 99) {
      if (iVar2 != 0x72) {
        if (iVar2 == 0x68) {
          if (PrintUsage(std::__cxx11::string_const&)::usage_abi_cxx11_ == '\0') {
            iVar2 = __cxa_guard_acquire(&PrintUsage(std::__cxx11::string_const&)::usage_abi_cxx11_);
            if (iVar2 != 0) {
              std::operator+(&local_d0,"usage: \nhelp digest:\n    ",&progName);
              std::operator+(&local_b0,&local_d0," -h|--help\nversion:\n    ");
              std::operator+(&local_90,&local_b0,&progName);
              std::operator+(&local_70,&local_90," -v|--version\ncommon options\n    ");
              std::operator+(&local_50,&local_70,&progName);
              std::operator+(&local_178,&local_50,
                             " [-r|--registry <registryFileName>] [-c|--config <configFileName>]\nor\n    "
                            );
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1a0,&local_178,&progName);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             PrintUsage(std::__cxx11::string_const&)::usage_abi_cxx11_,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1a0," [-r|--registry <registryFileName>] [configFileName]");
              std::__cxx11::string::~string((string *)local_1a0);
              std::__cxx11::string::~string((string *)&local_178);
              std::__cxx11::string::~string((string *)&local_50);
              std::__cxx11::string::~string((string *)&local_70);
              std::__cxx11::string::~string((string *)&local_90);
              std::__cxx11::string::~string((string *)&local_b0);
              std::__cxx11::string::~string((string *)&local_d0);
              __cxa_atexit(std::__cxx11::string::~string,
                           PrintUsage(std::__cxx11::string_const&)::usage_abi_cxx11_,&__dso_handle);
              __cxa_guard_release(&PrintUsage(std::__cxx11::string_const&)::usage_abi_cxx11_);
            }
          }
          ot::commissioner::Console::Write
                    ((string *)PrintUsage(std::__cxx11::string_const&)::usage_abi_cxx11_,kWhite);
        }
        else if (iVar2 == 0x76) {
          ot::commissioner::Commissioner::GetVersion_abi_cxx11_();
          ot::commissioner::Console::Write((string *)local_1a0,kWhite);
          std::__cxx11::string::~string((string *)local_1a0);
        }
        else {
          if (_optind != argc && configFileName._M_string_length == 0) {
            std::__cxx11::string::assign((char *)&configFileName);
          }
          sigemptyset((sigset_t *)&gSignalSet);
          sigaddset((sigset_t *)&gSignalSet,2);
          pthread_sigmask(0,(__sigset_t *)&gSignalSet,(__sigset_t *)0x0);
          std::thread::thread<void(&)(),,void>((thread *)local_1a0,HandleSignalInterrupt);
          std::thread::detach();
          std::thread::~thread((thread *)local_1a0);
          ot::commissioner::Console::Write(&kLogo_abi_cxx11_,kBlue);
          ot::commissioner::Interpreter::Init
                    ((Error *)local_1a0,&gInterpreter,&configFileName,&registryFileName);
          pEVar3 = ot::commissioner::Error::operator=(&error,(Error *)local_1a0);
          EVar1 = pEVar3->mCode;
          std::__cxx11::string::~string((string *)(local_1a0 + 8));
          if (EVar1 == kNone) {
            ot::commissioner::Interpreter::Run(&gInterpreter);
          }
        }
        if (error.mCode == kNone) {
          iVar2 = 0;
        }
        else {
          ot::commissioner::Error::ToString_abi_cxx11_(&local_178,&error);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1a0,"start OT-commissioner CLI failed: ",&local_178);
          ot::commissioner::Console::Write((string *)local_1a0,kRed);
          std::__cxx11::string::~string((string *)local_1a0);
          std::__cxx11::string::~string((string *)&local_178);
          iVar2 = -(uint)(error.mCode != kNone);
        }
        std::__cxx11::string::~string((string *)&configFileName);
        std::__cxx11::string::~string((string *)&registryFileName);
        std::__cxx11::string::~string((string *)&progName);
        std::__cxx11::string::~string((string *)&error.mMessage);
        return iVar2;
      }
      psVar4 = &registryFileName;
    }
    std::__cxx11::string::assign((char *)psVar4);
  } while( true );
}

Assistant:

int main(int argc, const char *argv[])
{
    using namespace ::ot::commissioner::utils;

    Error error;

    std::string progName = argv[0];
    std::string registryFileName;
    std::string configFileName;

    int  ch;
    bool parseParams = true;

    while (parseParams)
    {
        ch = getopt_long(argc, const_cast<char *const *>(argv), "hvc:r:", gCommissionerCliOptions, nullptr);
        switch (ch)
        {
        case 'h':
            PrintUsage(progName);
            ExitNow();
            break;
        case 'v':
            PrintVersion();
            ExitNow();
            break;
        case 'r':
            registryFileName = optarg;
            break;
        case 'c':
            configFileName = optarg;
            break;
        default:
            parseParams = false;
            break;
        };
    }
    argc -= optind;
    argv += optind;

    if (configFileName.empty())
    {
        // If any option left unprocessed then it must be a config file path
        if (argc != 0)
        {
            configFileName = argv[0];
        }
    }

    // Block signals in this thread and subsequently spawned threads.
    sigemptyset(&gSignalSet);
    sigaddset(&gSignalSet, SIGINT);
    pthread_sigmask(SIG_BLOCK, &gSignalSet, nullptr);

    std::thread(HandleSignalInterrupt).detach();

    Console::Write(kLogo, Console::Color::kBlue);

    SuccessOrExit(error = gInterpreter.Init(configFileName, registryFileName));

    gInterpreter.Run();

exit:
    if (error != ErrorCode::kNone)
    {
        Console::Write("start OT-commissioner CLI failed: " + error.ToString(), Console::Color::kRed);
    }
    return error == ErrorCode::kNone ? 0 : -1;
}